

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_dirname(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_40;
  int local_3c;
  int iDirlen;
  int iLen;
  char *zDir;
  char *zPath;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zPath = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((0 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) {
    zDir = jx9_value_to_string(*(jx9_value **)zPath,&local_3c);
    if (local_3c < 1) {
      jx9_result_string(pjStack_18,".",1);
      return 0;
    }
    _iDirlen = jx9ExtractDirName(zDir,local_3c,&local_40);
    jx9_result_string(pjStack_18,_iDirlen,local_40);
    return 0;
  }
  jx9_result_string(pjStack_18,"",0);
  return 0;
}

Assistant:

static int jx9Builtin_dirname(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zDir;
	int iLen, iDirlen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Reuturn "." */
		jx9_result_string(pCtx, ".", sizeof(char));
		return JX9_OK;
	}
	/* Perform the requested operation */
	zDir = jx9ExtractDirName(zPath, iLen, &iDirlen);
	/* Return directory name */
	jx9_result_string(pCtx, zDir, iDirlen);
	return JX9_OK;
}